

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O2

void __thiscall DateTime::FromTicks(DateTime *this,int *year,int *month,int *day)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined1 *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  uVar4 = this->m_encoded / 86400000000;
  iVar2 = (int)uVar4;
  iVar3 = (int)((long)((ulong)(uint)(iVar2 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / 0x23ab1);
  iVar8 = iVar3 * -0x23ab1;
  iVar7 = iVar8 + iVar2;
  iVar6 = iVar7 / 0x8eac;
  if ((iVar8 + iVar2) - 0x23ab0U < 0x8eac) {
    iVar6 = 3;
  }
  iVar7 = iVar6 * -0x8eac + iVar7;
  iVar2 = (iVar7 % 0x5b5) / 0x16d;
  if (iVar7 % 0x5b5 - 0x5b4U < 0x16d) {
    iVar2 = 3;
  }
  iVar6 = iVar2 + iVar6 * 100 + iVar3 * 400 + (iVar7 / 0x5b5) * 4 + 1;
  *year = iVar6;
  bVar1 = IsLeapYear(iVar6);
  puVar5 = (anonymous_namespace)::daysInMonth;
  if (bVar1) {
    puVar5 = (undefined1 *)0x114e34;
  }
  *month = 1;
  uVar4 = 1;
  iVar6 = iVar2 * -0x16d + iVar7 % 0x5b5;
  while ((uVar4 < 0xd && (iVar2 = *(int *)(puVar5 + uVar4 * 4), iVar2 <= iVar6))) {
    uVar4 = uVar4 + 1;
    *month = (int)uVar4;
    iVar6 = iVar6 - iVar2;
  }
  *day = iVar6 + 1;
  return;
}

Assistant:

void FromTicks(int& year, int& month, int& day) const
    {
        int totalDays = static_cast<int>(m_encoded / TicksPerDay);
        
        /*
         * number of 400 year cycles
         */
        int num400 = totalDays / 146097;
        totalDays -= num400 * 146097;
        /*
         * number of 100 year cycles
         */
        int num100 = totalDays / 36524;
        if (num100 == 4)
        {
            /*
             * last day of the last leap century
             */
            num100 = 3;
        }
        totalDays -= num100 * 36524;
        /*
         * number of 4 year cycles
         */
        int num4 = totalDays / 1461;
        totalDays -= num4 * 1461;
        /*
         * number of years
         */
        int num1 = totalDays / 365;
        if (num1 == 4)
        {
            /*
             * last day of the last leap olympiad
             */
            num1 = 3;
        }
        totalDays -= num1 * 365;

        /*
         * find year
         */
        year = (num400 * 400) + (num100 * 100) + (num4 * 4) + num1 + 1;
        
        /*
         * convert day of year to month/day
         */
        const int* daysInMonthPtr;
        if (IsLeapYear(year))
        {
            daysInMonthPtr = daysInMonth[1];
        }
        else
        {
            daysInMonthPtr = daysInMonth[0];
        }

        month = 1;
        while (totalDays >= daysInMonthPtr[month] && month <= 12)
        {
            totalDays -= daysInMonthPtr[month++];
        }

        day = totalDays + 1;
    }